

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

int Zyx_ManAddCnfLazyFunc(Zyx_Man_t *p,int iMint)

{
  int iVar1;
  Bmc_EsPar_t *pBVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int (*paiVar7) [32];
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  
  pBVar2 = p->pPars;
  if ((pBVar2->fMajority != 0) || (3 < pBVar2->nLutSize)) {
    __assert_fail("!p->pPars->fMajority && p->pPars->nLutSize < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                  ,0x427,"int Zyx_ManAddCnfLazyFunc(Zyx_Man_t *, int)");
  }
  p->Counts[iMint] = p->Counts[iMint] + 1;
  if (pBVar2->nLutSize == 3) {
    uVar10 = pBVar2->nVars;
    if ((int)uVar10 < p->nObjs) {
      do {
        if (0 < (int)uVar10) {
          paiVar7 = p->pFanins + uVar10;
          uVar3 = 0;
          do {
            uVar4 = uVar3 + 1;
            uVar8 = uVar4;
            while (uVar11 = uVar8, (int)uVar11 < (int)uVar10) {
              for (uVar9 = uVar11 + 1; uVar8 = uVar11 + 1, (int)uVar9 < (int)uVar10;
                  uVar9 = uVar9 + 1) {
                (*paiVar7)[0] = uVar3;
                (*paiVar7)[1] = uVar11;
                (*paiVar7)[2] = uVar9;
                if (-1 < p->LutMask) {
                  uVar8 = 0;
                  do {
                    iVar12 = 0;
                    do {
                      p->nLits[0] = 0;
                      pBVar2 = p->pPars;
                      iVar5 = (uVar10 - pBVar2->nVars) * (p->LutMask + 1) + uVar8;
                      if (iVar5 < 0) goto LAB_005ad39b;
                      p->nLits[0] = 1;
                      p->pLits[0][0] = iVar12 + iVar5 * 2;
                      if (0 < pBVar2->nLutSize) {
                        lVar6 = 0;
                        do {
                          iVar5 = p->TopoBase + p->pFanins[uVar10][lVar6] +
                                  (uVar10 - pBVar2->nVars) * p->nObjs;
                          if (iVar5 < 0) goto LAB_005ad39b;
                          iVar1 = p->nLits[0];
                          p->nLits[0] = iVar1 + 1;
                          p->pLits[0][iVar1] = iVar5 * 2 + 1;
                          iVar5 = p->MintBase + p->pFanins[uVar10][lVar6] + p->nObjs * iMint;
                          if (iVar5 < 0) goto LAB_005ad39b;
                          iVar1 = p->nLits[0];
                          p->nLits[0] = iVar1 + 1;
                          p->pLits[0][iVar1] =
                               (uint)((uVar8 >> ((uint)lVar6 & 0x1f) & 1) != 0) + iVar5 * 2;
                          lVar6 = lVar6 + 1;
                        } while (lVar6 < pBVar2->nLutSize);
                      }
                      iVar5 = p->MintBase + uVar10 + p->nObjs * iMint;
                      if (iVar5 < 0) goto LAB_005ad39b;
                      iVar1 = p->nLits[0];
                      p->nLits[0] = iVar1 + 1;
                      p->pLits[0][iVar1] = iVar12 + iVar5 * 2 ^ 1;
                      iVar5 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
                      if (iVar5 == 0) {
                        return 0;
                      }
                      bVar13 = iVar12 == 0;
                      iVar12 = iVar12 + 1;
                    } while (bVar13);
                    bVar13 = (int)uVar8 < p->LutMask;
                    uVar8 = uVar8 + 1;
                  } while (bVar13);
                }
              }
            }
            uVar3 = uVar4;
          } while (uVar4 != uVar10);
        }
        uVar10 = uVar10 + 1;
      } while ((int)uVar10 < p->nObjs);
    }
  }
  else if ((pBVar2->nLutSize == 2) && (uVar10 = pBVar2->nVars, (int)uVar10 < p->nObjs)) {
    do {
      if (0 < (int)uVar10) {
        uVar3 = 0;
        do {
          uVar4 = uVar3 + 1;
          for (uVar8 = uVar4; (int)uVar8 < (int)uVar10; uVar8 = uVar8 + 1) {
            p->pFanins[uVar10][0] = uVar3;
            p->pFanins[uVar10][1] = uVar8;
            if (-1 < p->LutMask) {
              uVar11 = 0;
              do {
                iVar12 = 0;
                do {
                  p->nLits[0] = 0;
                  pBVar2 = p->pPars;
                  iVar5 = (uVar10 - pBVar2->nVars) * (p->LutMask + 1) + uVar11;
                  if (iVar5 < 0) {
LAB_005ad39b:
                    __assert_fail("Var >= 0 && !(c >> 1)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                  ,0x12e,"int Abc_Var2Lit(int, int)");
                  }
                  p->nLits[0] = 1;
                  p->pLits[0][0] = iVar12 + iVar5 * 2;
                  if (0 < pBVar2->nLutSize) {
                    lVar6 = 0;
                    do {
                      iVar5 = p->TopoBase + p->pFanins[uVar10][lVar6] +
                              (uVar10 - pBVar2->nVars) * p->nObjs;
                      if (iVar5 < 0) goto LAB_005ad39b;
                      iVar1 = p->nLits[0];
                      p->nLits[0] = iVar1 + 1;
                      p->pLits[0][iVar1] = iVar5 * 2 + 1;
                      iVar5 = p->MintBase + p->pFanins[uVar10][lVar6] + p->nObjs * iMint;
                      if (iVar5 < 0) goto LAB_005ad39b;
                      iVar1 = p->nLits[0];
                      p->nLits[0] = iVar1 + 1;
                      p->pLits[0][iVar1] =
                           (uint)((uVar11 >> ((uint)lVar6 & 0x1f) & 1) != 0) + iVar5 * 2;
                      lVar6 = lVar6 + 1;
                    } while (lVar6 < pBVar2->nLutSize);
                  }
                  iVar5 = p->MintBase + uVar10 + p->nObjs * iMint;
                  if (iVar5 < 0) goto LAB_005ad39b;
                  iVar1 = p->nLits[0];
                  p->nLits[0] = iVar1 + 1;
                  p->pLits[0][iVar1] = iVar12 + iVar5 * 2 ^ 1;
                  iVar5 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
                  if (iVar5 == 0) {
                    return 0;
                  }
                  bVar13 = iVar12 == 0;
                  iVar12 = iVar12 + 1;
                } while (bVar13);
                bVar13 = (int)uVar11 < p->LutMask;
                uVar11 = uVar11 + 1;
              } while (bVar13);
            }
          }
          uVar3 = uVar4;
        } while (uVar4 != uVar10);
      }
      uVar10 = uVar10 + 1;
    } while ((int)uVar10 < p->nObjs);
  }
  return 1;
}

Assistant:

int Zyx_ManAddCnfLazyFunc( Zyx_Man_t * p, int iMint )
{
    int i, k, n, j, s, t, u;
    //printf( "Adding clauses for minterm %d with value %d.\n", iMint, Value );
    assert( !p->pPars->fMajority && p->pPars->nLutSize < 4 );
    p->Counts[iMint]++;
    if ( p->pPars->nLutSize == 2 )
    {
        for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        for ( s = 0;               s < i;        s++ )
        for ( t = s+1;             t < i;        t++ )
        {
            p->pFanins[i][0] = s;
            p->pFanins[i][1] = t;
            for ( k = 0; k <= p->LutMask; k++ )
            for ( n = 0; n < 2; n++ )
            {
                p->nLits[0] = 0;
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_FuncVar(p, i, k), n );
                for ( j = 0; j < p->pPars->nLutSize; j++ )
                {
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_TopoVar(p, i, p->pFanins[i][j]), 1 );
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, p->pFanins[i][j]), (k >> j) & 1 );
                }
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, i), !n );
                if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                    return 0;
            }
        }
    }
    else if ( p->pPars->nLutSize == 3 )
    {
        for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        for ( s = 0;               s < i;        s++ )
        for ( t = s+1;             t < i;        t++ )
        for ( u = t+1;             u < i;        u++ )
        {
            p->pFanins[i][0] = s;
            p->pFanins[i][1] = t;
            p->pFanins[i][2] = u;
            for ( k = 0; k <= p->LutMask; k++ )
            for ( n = 0; n < 2; n++ )
            {
                p->nLits[0] = 0;
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_FuncVar(p, i, k), n );
                for ( j = 0; j < p->pPars->nLutSize; j++ )
                {
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_TopoVar(p, i, p->pFanins[i][j]), 1 );
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, p->pFanins[i][j]), (k >> j) & 1 );
                }
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, i), !n );
                if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                    return 0;
            }
        }
    }
    return 1;
}